

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long mkvparser::ParseElementHeader
               (IMkvReader *pReader,longlong *pos,longlong stop,longlong *id,longlong *size)

{
  longlong lVar1;
  unsigned_long_long rollover_check;
  long len;
  longlong *size_local;
  longlong *id_local;
  longlong stop_local;
  longlong *pos_local;
  IMkvReader *pReader_local;
  
  if ((stop < 0) || (*pos < stop)) {
    len = (long)size;
    size_local = id;
    id_local = (longlong *)stop;
    stop_local = (longlong)pos;
    pos_local = (longlong *)pReader;
    lVar1 = ReadID(pReader,*pos,(long *)&rollover_check);
    *size_local = lVar1;
    if (*size_local < 0) {
      pReader_local = (IMkvReader *)0xfffffffffffffffe;
    }
    else {
      *(unsigned_long_long *)stop_local = rollover_check + *(long *)stop_local;
      if (((long)id_local < 0) || (*(long *)stop_local < (long)id_local)) {
        lVar1 = ReadUInt((IMkvReader *)pos_local,*(longlong *)stop_local,(long *)&rollover_check);
        *(longlong *)len = lVar1;
        if ((*(long *)len < 0) || (((long)rollover_check < 1 || (8 < (long)rollover_check)))) {
          pReader_local = (IMkvReader *)0xfffffffffffffffe;
        }
        else if (*(long *)stop_local + rollover_check < 0x8000000000000000) {
          *(unsigned_long_long *)stop_local = rollover_check + *(long *)stop_local;
          if (((long)id_local < 0) || (*(long *)stop_local <= (long)id_local)) {
            pReader_local = (IMkvReader *)0x0;
          }
          else {
            pReader_local = (IMkvReader *)0xfffffffffffffffe;
          }
        }
        else {
          pReader_local = (IMkvReader *)0xfffffffffffffffe;
        }
      }
      else {
        pReader_local = (IMkvReader *)0xfffffffffffffffe;
      }
    }
  }
  else {
    pReader_local = (IMkvReader *)0xfffffffffffffffe;
  }
  return (long)pReader_local;
}

Assistant:

long ParseElementHeader(IMkvReader* pReader, long long& pos, long long stop,
                        long long& id, long long& size) {
  if (stop >= 0 && pos >= stop)
    return E_FILE_FORMAT_INVALID;

  long len;

  id = ReadID(pReader, pos, len);

  if (id < 0)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume id

  if (stop >= 0 && pos >= stop)
    return E_FILE_FORMAT_INVALID;

  size = ReadUInt(pReader, pos, len);

  if (size < 0 || len < 1 || len > 8) {
    // Invalid: Negative payload size, negative or 0 length integer, or integer
    // larger than 64 bits (libwebm cannot handle them).
    return E_FILE_FORMAT_INVALID;
  }

  // Avoid rolling over pos when very close to LLONG_MAX.
  const unsigned long long rollover_check =
      static_cast<unsigned long long>(pos) + len;
  if (rollover_check > LLONG_MAX)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume length of size

  // pos now designates payload

  if (stop >= 0 && pos > stop)
    return E_FILE_FORMAT_INVALID;

  return 0;  // success
}